

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  ChunkHeader *pCVar1;
  ulong __n;
  ulong size;
  uint8_t *puVar2;
  void *newBuffer;
  size_t increment;
  size_t newSize_local;
  size_t originalSize_local;
  void *originalPtr_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (originalPtr == (void *)0x0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,newSize);
  }
  else {
    if (this->shared_->refcount == 0) {
      __assert_fail("shared_->refcount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                    ,0x155,
                    "void *rapidjson::MemoryPoolAllocator<>::Realloc(void *, size_t, size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                   );
    }
    if (newSize == 0) {
      this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
    }
    else {
      __n = originalSize + 7 & 0xfffffffffffffff8;
      size = newSize + 7 & 0xfffffffffffffff8;
      this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)originalPtr;
      if (__n < size) {
        puVar2 = GetChunkBuffer(this->shared_);
        if (((uint8_t *)originalPtr == puVar2 + (this->shared_->chunkHead->size - __n)) &&
           (this->shared_->chunkHead->size + (size - __n) <= this->shared_->chunkHead->capacity)) {
          pCVar1 = this->shared_->chunkHead;
          pCVar1->size = (size - __n) + pCVar1->size;
        }
        else {
          this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,size);
          if (this_local == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
            this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
          }
          else if (__n != 0) {
            memcpy(this_local,originalPtr,__n);
          }
        }
      }
    }
  }
  return this_local;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (newSize == 0)
            return NULL;

        originalSize = RAPIDJSON_ALIGN(originalSize);
        newSize = RAPIDJSON_ALIGN(newSize);

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == GetChunkBuffer(shared_) + shared_->chunkHead->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            if (shared_->chunkHead->size + increment <= shared_->chunkHead->capacity) {
                shared_->chunkHead->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        if (void* newBuffer = Malloc(newSize)) {
            if (originalSize)
                std::memcpy(newBuffer, originalPtr, originalSize);
            return newBuffer;
        }
        else
            return NULL;
    }